

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

NanoVDBBuffer * __thiscall pbrt::NanoVDBBuffer::operator=(NanoVDBBuffer *this,NanoVDBBuffer *other)

{
  memory_resource *r;
  polymorphic_allocator<std::byte> *in_RSI;
  NanoVDBBuffer *in_RDI;
  NanoVDBBuffer *unaff_retaddr;
  
  clear(unaff_retaddr);
  r = pstd::pmr::polymorphic_allocator<std::byte>::resource(in_RSI);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(&in_RDI->alloc,r);
  in_RDI->bytesAllocated = (size_t)in_RSI[1].memoryResource;
  in_RDI->ptr = (uint8_t *)in_RSI[2].memoryResource;
  in_RSI[1].memoryResource = (memory_resource *)0x0;
  in_RSI[2].memoryResource = (memory_resource *)0x0;
  return in_RDI;
}

Assistant:

NanoVDBBuffer &operator=(NanoVDBBuffer &&other) noexcept {
        // Note, this isn't how std containers work, but it's expedient for
        // our purposes here...
        clear();
        // operator= was deleted? Fine.
        new (&alloc) Allocator(other.alloc.resource());
        bytesAllocated = other.bytesAllocated;
        ptr = other.ptr;
        other.bytesAllocated = 0;
        other.ptr = nullptr;
        return *this;
    }